

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_4::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  uint8_t uVar1;
  string *psVar2;
  Options *in_RCX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  char *value;
  long lVar3;
  AlphaNum *in_R8;
  bool bVar4;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  allocator_type local_ad5;
  allocator<char> local_ad4;
  allocator<char> local_ad3;
  allocator<char> local_ad2;
  allocator<char> local_ad1;
  allocator<char> local_ad0;
  allocator<char> local_acf;
  allocator<char> local_ace;
  allocator<char> local_acd;
  allocator<char> local_acc;
  allocator<char> local_acb;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  string lazy_var;
  AlphaNum local_aa8;
  string trivial_default;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string *local_888;
  string local_880;
  string local_860;
  string local_840;
  AlphaNum local_820;
  string_view local_7f0;
  string_view local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790 [11];
  AlphaNum local_6d8;
  string_view local_6a8;
  undefined1 local_5f0 [184];
  undefined1 local_538 [184];
  undefined1 local_480 [184];
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  if (opts->experimental_use_micro_string == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&trivial_default,"::absl::string_view()",(allocator<char> *)&local_820);
  }
  else {
    local_6a8 = absl::lts_20250127::NullSafeStringView("::");
    bVar4 = opts->opensource_runtime != false;
    local_790[0]._0_8_ = (FieldDescriptor *)0x6;
    if (bVar4) {
      local_790[0]._0_8_ = (FieldDescriptor *)0x10;
    }
    local_790[0]._8_8_ = "proto2";
    if (bVar4) {
      local_790[0]._8_8_ = "google::protobuf";
    }
    local_7f0 = absl::lts_20250127::NullSafeStringView("::internal::GetEmptyStringAlreadyInited()");
    in_RCX = (Options *)&local_7f0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&trivial_default,(lts_20250127 *)&local_6a8,(AlphaNum *)local_790,(AlphaNum *)in_RCX,
               in_R8);
  }
  if (opts->experimental_use_micro_string == true) {
    local_6a8 = absl::lts_20250127::NullSafeStringView("Impl_::");
    MakeDefaultFieldName_abi_cxx11_
              ((string *)&local_aa8,(cpp *)field,(FieldDescriptor *)local_6a8._M_str);
    local_790[0]._M_allocated_capacity = local_aa8.piece_._M_str;
    local_790[0]._8_8_ = local_aa8.piece_._M_len;
    field_00 = (FieldDescriptor *)local_aa8.piece_._M_str;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&lazy_var,(lts_20250127 *)&local_6a8,(AlphaNum *)local_790,
               (AlphaNum *)local_aa8.piece_._M_str);
  }
  else {
    QualifiedClassName_abi_cxx11_
              ((string *)&local_aa8,(cpp *)field->containing_type_,(Descriptor *)opts,in_RCX);
    local_7f0._M_str = (char *)local_aa8.piece_._M_len;
    local_7f0._M_len = (size_t)local_aa8.piece_._M_str;
    local_820.piece_ = absl::lts_20250127::NullSafeStringView("::");
    MakeDefaultFieldName_abi_cxx11_
              (&local_9b8,(cpp *)field,(FieldDescriptor *)local_820.piece_._M_str);
    field_00 = (FieldDescriptor *)&local_7c0;
    local_7c0._M_str = local_9b8._M_dataplus._M_p;
    local_7c0._M_len = local_9b8._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&lazy_var,(lts_20250127 *)&local_7f0,&local_820,(AlphaNum *)field_00,in_R8);
    std::__cxx11::string::~string((string *)&local_9b8);
  }
  std::__cxx11::string::~string((string *)&local_aa8);
  psVar2 = ((field->field_20).default_value_enum_)->all_names_;
  uVar1 = field->type_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"kDefault",&local_ac9);
  DefaultValue_abi_cxx11_(&local_860,(cpp *)opts,(Options *)field,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&local_6a8,&local_840,&local_860);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"kDefaultLen",&local_aca);
  local_888 = ((field->field_20).default_value_enum_)->all_names_;
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_5f0,&local_880,(unsigned_long *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"default_variable_name",&local_acb);
  MakeDefaultName_abi_cxx11_(&local_8c8,(cpp *)field,field_01);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_538,&local_8a8,&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"default_variable_field",&local_acc);
  MakeDefaultFieldName_abi_cxx11_(&local_908,(cpp *)field,field_02);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_480,&local_8e8,&local_908);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"kDefaultStr",&local_acd);
  if (psVar2 == (string *)0x0) {
    std::__cxx11::string::string((string *)&local_a18,(string *)&trivial_default);
  }
  else {
    local_7f0._M_str = lazy_var._M_dataplus._M_p;
    local_7f0._M_len = lazy_var._M_string_length;
    local_820.piece_ = absl::lts_20250127::NullSafeStringView(".get()");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a18,(lts_20250127 *)&local_7f0,&local_820,&local_820);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_928,&local_a18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"kDefaultValue",&local_ace);
  if (psVar2 == (string *)0x0) {
    local_7c0 = absl::lts_20250127::NullSafeStringView("&");
    local_aa8.piece_._M_len = trivial_default._M_string_length;
    local_aa8.piece_._M_str = trivial_default._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a38,(lts_20250127 *)&local_7c0,&local_aa8,
               (AlphaNum *)trivial_default._M_string_length);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"nullptr",&local_acf);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_948,&local_a38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"lazy_var",&local_ad0);
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_258,&local_968,&lazy_var);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"lazy_args",&local_ad1);
  if (psVar2 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"",&local_ad2);
  }
  else {
    local_9b8._M_dataplus._M_p = (pointer)lazy_var._M_string_length;
    local_9b8._M_string_length = (size_type)lazy_var._M_dataplus._M_p;
    local_6d8.piece_ = absl::lts_20250127::NullSafeStringView(",");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a58,(lts_20250127 *)&local_9b8,&local_6d8,&local_6d8);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_790,&local_988,&local_a58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,",",&local_ad3);
  io::Printer::Sub::WithSuffix(&local_1a0,(Sub *)local_790,&local_9d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"byte",&local_ad4);
  value = "char";
  if (uVar1 == '\f') {
    value = "void";
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_e8,&local_9f8,(char (*) [5])value);
  __l._M_len = 9;
  __l._M_array = (Sub *)&local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_ad5);
  lVar3 = 0x5c0;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&(((Sub *)&local_6a8)->key_)._M_dataplus + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d8);
  io::Printer::Sub::~Sub((Sub *)local_790);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&lazy_var);
  std::__cxx11::string::~string((string *)&trivial_default);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& options) {
  bool cold = ShouldSplit(field, options);
  return {
      {"Type", PrimitiveTypeName(options, field->cpp_type())},
      {"kDefault", DefaultValue(options, field)},
      {"_field_cached_byte_size_", MakeVarintCachedSizeFieldName(field, cold)},
  };
}